

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.h
# Opt level: O2

cmListFileContext *
cmListFileContext::FromCommandContext
          (cmListFileContext *__return_storage_ptr__,cmCommandContext *lfcc,string *fileName)

{
  (__return_storage_ptr__->Name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Name).field_2
  ;
  (__return_storage_ptr__->Name)._M_string_length = 0;
  (__return_storage_ptr__->Name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->FilePath)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->FilePath).field_2;
  (__return_storage_ptr__->FilePath)._M_string_length = 0;
  (__return_storage_ptr__->FilePath).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->Line = 0;
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->FilePath);
  __return_storage_ptr__->Line = lfcc->Line;
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static cmListFileContext FromCommandContext(cmCommandContext const& lfcc,
                                              std::string const& fileName)
  {
    cmListFileContext lfc;
    lfc.FilePath = fileName;
    lfc.Line = lfcc.Line;
    lfc.Name = lfcc.Name.Original;
    return lfc;
  }